

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::Initialize
          (Recycler *this,bool forceInThread,ThreadService *threadService,bool deferThreadStartup,
          PageHeapMode pageheapmode,bool captureAllocCallStack,bool captureFreeCallStack)

{
  bool bVar1;
  ConfigFlagsTable *pCVar2;
  RecyclerMemoryData *pRVar3;
  ThreadContextId pvVar4;
  DWORD local_50;
  byte local_49;
  uint numProcs;
  bool needWriteWatch;
  bool dontNeedDetailedTracking;
  bool captureFreeCallStack_local;
  bool captureAllocCallStack_local;
  PageHeapMode pageheapmode_local;
  bool deferThreadStartup_local;
  ThreadService *threadService_local;
  bool forceInThread_local;
  Recycler *this_local;
  
  InitializeProfileAllocTracker(this);
  pCVar2 = GetRecyclerFlagsTable(this);
  bVar1 = Js::Phases::IsEnabled(&pCVar2->Off,RecyclerPhase);
  this->disableCollection = bVar1;
  this->skipStack = false;
  pCVar2 = GetRecyclerFlagsTable(this);
  bVar1 = Js::Phases::IsEnabled(&pCVar2->Off,PartialCollectPhase);
  this->enablePartialCollect = (bool)((bVar1 ^ 0xffU) & 1);
  pRVar3 = MemoryProfiler::GetRecyclerMemoryData();
  this->memoryData = pRVar3;
  pvVar4 = GetCurrentThreadContextId();
  this->mainThreadId = pvVar4;
  (this->collectionParam).domCollect = false;
  local_49 = 1;
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    local_49 = this->verifyEnabled ^ 0xff;
  }
  if ((local_49 & 1) == 0) {
    HeapInfoManager::Initialize
              (&this->autoHeap,this,pageheapmode,captureAllocCallStack,captureFreeCallStack);
  }
  else {
    HeapInfoManager::Initialize
              (&this->autoHeap,this,TrackNativeAllocatedMemoryBlock,pageheapmode,
               captureAllocCallStack,captureFreeCallStack);
  }
  MarkContext::Init(&this->markContext,2);
  this->isPrimaryMarkContextInitialized = true;
  bVar1 = HeapInfoManager::IsPageHeapEnabled(&this->autoHeap);
  this->isPageHeapEnabled = bVar1;
  bVar1 = IsPageHeapEnabled(this);
  if (bVar1) {
    bVar1 = HeapInfoManager::DoCaptureAllocCallStack(&this->autoHeap);
    this->capturePageHeapAllocStack = bVar1;
    bVar1 = HeapInfoManager::DoCaptureFreeCallStack(&this->autoHeap);
    this->capturePageHeapFreeStack = bVar1;
  }
  pCVar2 = GetRecyclerFlagsTable(this);
  if ((pCVar2->RecyclerTrackStress & 1U) != 0) {
    this->enablePartialCollect = false;
  }
  pCVar2 = GetRecyclerFlagsTable(this);
  this->recyclerStress = (bool)(pCVar2->RecyclerStress & 1);
  pCVar2 = GetRecyclerFlagsTable(this);
  this->recyclerBackgroundStress = (bool)(pCVar2->RecyclerBackgroundStress & 1);
  pCVar2 = GetRecyclerFlagsTable(this);
  this->recyclerConcurrentStress = (bool)(pCVar2->RecyclerConcurrentStress & 1);
  pCVar2 = GetRecyclerFlagsTable(this);
  this->recyclerConcurrentRepeatStress = (bool)(pCVar2->RecyclerConcurrentRepeatStress & 1);
  pCVar2 = GetRecyclerFlagsTable(this);
  this->recyclerPartialStress = (bool)(pCVar2->RecyclerPartialStress & 1);
  local_50 = AutoSystemInfo::GetNumberOfPhysicalProcessors(&AutoSystemInfo::Data);
  if (local_50 < 5) {
    pCVar2 = GetRecyclerFlagsTable(this);
    bVar1 = Js::Phases::IsEnabled(&pCVar2->Force,ParallelMarkPhase);
    if (bVar1) goto LAB_0032e429;
  }
  else {
LAB_0032e429:
    local_50 = 4;
  }
  this->maxParallelism = local_50;
  if (forceInThread) {
    this->disableConcurrent = true;
  }
  else {
    pCVar2 = GetRecyclerFlagsTable(this);
    bVar1 = Js::Phases::IsEnabled(&pCVar2->Off,ConcurrentCollectPhase);
    if (bVar1) {
      this->disableConcurrent = true;
    }
    else {
      pCVar2 = GetRecyclerFlagsTable(this);
      bVar1 = Js::Phases::IsEnabled(&pCVar2->Off,ConcurrentMarkPhase);
      if (bVar1) {
        pCVar2 = GetRecyclerFlagsTable(this);
        bVar1 = Js::Phases::IsEnabled(&pCVar2->Off,ParallelMarkPhase);
        if (bVar1) {
          pCVar2 = GetRecyclerFlagsTable(this);
          bVar1 = Js::Phases::IsEnabled(&pCVar2->Off,ConcurrentSweepPhase);
          if (bVar1) {
            this->disableConcurrent = true;
            goto LAB_0032e533;
          }
        }
      }
      this->disableConcurrent = false;
      if (!deferThreadStartup) {
        EnableConcurrent(this,threadService,false);
      }
    }
  }
LAB_0032e533:
  CCLock::Enter(&recyclerListLock.super_CCLock);
  this->next = recyclerList;
  recyclerList = this;
  CCLock::Leave(&recyclerListLock.super_CCLock);
  return;
}

Assistant:

void
Recycler::Initialize(const bool forceInThread, JsUtil::ThreadService *threadService, const bool deferThreadStartup
#ifdef RECYCLER_PAGE_HEAP
    , PageHeapMode pageheapmode
    , bool captureAllocCallStack
    , bool captureFreeCallStack
#endif
)
{
#ifdef PROFILE_RECYCLER_ALLOC
    this->InitializeProfileAllocTracker();
#endif
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    this->disableCollection = CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::RecyclerPhase);
#endif
#if ENABLE_CONCURRENT_GC
    this->skipStack = false;
#endif

#if ENABLE_PARTIAL_GC
#if ENABLE_DEBUG_CONFIG_OPTIONS
    this->enablePartialCollect = !CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::PartialCollectPhase);
#else
    this->enablePartialCollect = true;
#endif
#endif

#ifdef PROFILE_MEM
    this->memoryData = MemoryProfiler::GetRecyclerMemoryData();
#endif

#if DBG || DBG_DUMP || defined(RECYCLER_TRACE)
    mainThreadId = GetCurrentThreadContextId();
#endif

#ifdef RECYCLER_TRACE
    collectionParam.domCollect = false;
#endif

#if defined(PROFILE_RECYCLER_ALLOC) || defined(RECYCLER_MEMORY_VERIFY) || defined(MEMSPECT_TRACKING) || defined(ETW_MEMORY_TRACKING)
    bool dontNeedDetailedTracking = false;

#if defined(PROFILE_RECYCLER_ALLOC)
    dontNeedDetailedTracking = dontNeedDetailedTracking || this->trackerDictionary == nullptr;
#endif

#if defined(RECYCLER_MEMORY_VERIFY)
    dontNeedDetailedTracking = dontNeedDetailedTracking || !this->verifyEnabled;
#endif

    // If we need detailed tracking we force allocation fast path in the JIT to fail and go to the helper, so there is no
    // need for the TrackNativeAllocatedMemoryBlock callback.
    if (dontNeedDetailedTracking)
    {
        autoHeap.Initialize(this, TrackNativeAllocatedMemoryBlock
#ifdef RECYCLER_PAGE_HEAP
            , pageheapmode
            , captureAllocCallStack
            , captureFreeCallStack
#endif
        );
    }
    else
    {
        autoHeap.Initialize(this
#ifdef RECYCLER_PAGE_HEAP
            , pageheapmode
            , captureAllocCallStack
            , captureFreeCallStack
#endif
        );
    }
#else
    autoHeap.Initialize(this
#ifdef RECYCLER_PAGE_HEAP
        , pageheapmode
        , captureAllocCallStack
        , captureFreeCallStack
#endif
    );
#endif

    markContext.Init(Recycler::PrimaryMarkStackReservedPageCount);

#if defined(RECYCLER_DUMP_OBJECT_GRAPH) || defined(LEAK_REPORT) || defined(CHECK_MEMORY_LEAK)
    isPrimaryMarkContextInitialized = true;
#endif

#ifdef RECYCLER_PAGE_HEAP
    isPageHeapEnabled = autoHeap.IsPageHeapEnabled();
    if (IsPageHeapEnabled())
    {
        capturePageHeapAllocStack = autoHeap.DoCaptureAllocCallStack();
        capturePageHeapFreeStack = autoHeap.DoCaptureFreeCallStack();
    }
#endif

#ifdef RECYCLER_STRESS
#if ENABLE_PARTIAL_GC
    if (GetRecyclerFlagsTable().RecyclerTrackStress)
    {
        // Disable partial if we are doing track stress, since partial relies on ClientTracked processing
        // and track stress doesn't support this.
        this->enablePartialCollect = false;
    }
#endif

    this->recyclerStress = GetRecyclerFlagsTable().RecyclerStress;
#if ENABLE_CONCURRENT_GC
    this->recyclerBackgroundStress = GetRecyclerFlagsTable().RecyclerBackgroundStress;
    this->recyclerConcurrentStress = GetRecyclerFlagsTable().RecyclerConcurrentStress;
    this->recyclerConcurrentRepeatStress = GetRecyclerFlagsTable().RecyclerConcurrentRepeatStress;
#endif
#if ENABLE_PARTIAL_GC
    this->recyclerPartialStress = GetRecyclerFlagsTable().RecyclerPartialStress;
#endif
#endif

    bool needWriteWatch = false;

#if ENABLE_CONCURRENT_GC
    // Default to non-concurrent
    uint numProcs = (uint)AutoSystemInfo::Data.GetNumberOfPhysicalProcessors();
    this->maxParallelism = (numProcs > 4) || CUSTOM_PHASE_FORCE1(GetRecyclerFlagsTable(), Js::ParallelMarkPhase) ? 4 : numProcs;

    if (forceInThread)
    {
        // Requested a non-concurrent recycler
        this->disableConcurrent = true;
    }
#if ENABLE_DEBUG_CONFIG_OPTIONS
    else if (CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentCollectPhase))
    {
        // Concurrent collection disabled
        this->disableConcurrent = true;
    }
    else if (CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentMarkPhase) &&
        CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ParallelMarkPhase) &&
        CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentSweepPhase))
    {
        // All concurrent collection phases disabled
        this->disableConcurrent = true;
    }
#endif
    else
    {
        this->disableConcurrent = false;

        if (deferThreadStartup || EnableConcurrent(threadService, false))
        {
#ifdef RECYCLER_WRITE_WATCH
            needWriteWatch = true;
#endif
        }
    }
#endif // ENABLE_CONCURRENT_GC

#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
#ifdef RECYCLER_WRITE_WATCH
        needWriteWatch = true;
#endif
    }
#endif

#if ENABLE_PARTIAL_GC || ENABLE_CONCURRENT_GC
#ifdef RECYCLER_WRITE_WATCH
    if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        if (needWriteWatch)
        {
            // need write watch to support concurrent and/or partial collection
            autoHeap.EnableWriteWatch();
        }
    }
#endif
#else
    Assert(!needWriteWatch);
#endif
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    recyclerListLock.Enter();
    this->next = recyclerList;
    recyclerList = this;
    recyclerListLock.Leave();
#endif
}